

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O1

void __thiscall CSocekt::flyd_wait_request_handler_proc_plast(CSocekt *this,lp_connection_t c)

{
  int irmqc;
  function<void_()> tCall;
  int local_5c;
  _Any_data local_58;
  _Manager_type local_48;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_5c = 0;
  inMsgRecvQueue(this,c->pnewMemPointer,&local_5c);
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_38._M_unused._0_8_ = 0x31;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = 0;
  *(CLogicSocket **)((long)local_38._M_unused._0_8_ + 0x10) = &g_socket;
  pcStack_20 = std::
               _Function_handler<void_(),_std::_Bind<void_(CLogicSocket::*(CLogicSocket_*))()>_>::
               _M_invoke;
  local_28 = std::_Function_handler<void_(),_std::_Bind<void_(CLogicSocket::*(CLogicSocket_*))()>_>
             ::_M_manager;
  std::function<void_()>::function((function<void_()> *)&local_58,(function<void_()> *)&local_38);
  muduo::ThreadPool::run(&g_threadpool,(Task *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  c->ifnewrecvMem = false;
  c->pnewMemPointer = (char *)0x0;
  c->curStat = '\0';
  c->precvbuf = c->dataHeadInfo;
  c->irecvlen = (uint)this->m_iLenPkgHeader;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void CSocekt::flyd_wait_request_handler_proc_plast(lp_connection_t c)
{
    //把这段内存放到消息队列中来；
   // inMsgRecvQueue(c->pnewMemPointer);
    //......这里可能考虑触发业务逻辑，怎么触发业务逻辑，这个代码以后再考虑扩充。。。。。。

    int irmqc = 0; //表示消息队列当前信息数量
    inMsgRecvQueue(c->pnewMemPointer, irmqc);

    std::function<void ()> tCall = std::bind(&CLogicSocket::threadRecvProcFunc,
                                            &g_socket);

    g_threadpool.run(tCall);

    c->ifnewrecvMem    = false;            //内存不再需要释放，因为你收完整了包，这个包被上边调用inMsgRecvQueue()移入消息队列，那么释放内存就属于业务逻辑去干，不需要回收连接到连接池中干了
    c->pnewMemPointer  = NULL;
    c->curStat         = _PKG_HD_INIT;     //收包状态机的状态恢复为原始态，为收下一个包做准备
    c->precvbuf        = c->dataHeadInfo;  //设置好收包的位置
    c->irecvlen        = m_iLenPkgHeader;  //设置好要接收数据的大小
    return;
}